

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_base.h
# Opt level: O0

bool __thiscall
LineBase2D<double>::intersection
          (LineBase2D<double> *this,LineBase2D<double> *line,PointBase2D<double> *point)

{
  double *in_RDX;
  long in_RSI;
  PointBase2D<double> *in_RDI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  PointBase2D<double> PVar7;
  double na;
  PointBase2D<double> offset;
  double denominator;
  PointBase2D<double> *in_stack_ffffffffffffff88;
  PointBase2D<double> local_68;
  double local_58;
  double local_50;
  double local_48;
  PointBase2D<double> local_40;
  undefined8 local_30;
  double local_28;
  double *local_20;
  long local_18;
  bool local_1;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_RDI[1].y;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(in_RSI + 0x10);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = -(in_RDI[1].x * *(double *)(in_RSI + 0x18));
  auVar1 = vfmadd213sd_fma(auVar1,auVar3,auVar5);
  local_28 = auVar1._0_8_;
  local_30 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_1 = pvmath::isEqual<double>(&in_RDI->x,&in_stack_ffffffffffffff88->x,1.19217546275847e-317);
  if (!local_1) {
    local_40 = PointBase2D<double>::operator-(in_RDI,in_stack_ffffffffffffff88);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(local_18 + 0x18);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_40.x;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = -(*(double *)(local_18 + 0x10) * local_40.y);
    auVar1 = vfmadd213sd_fma(auVar2,auVar4,auVar6);
    local_48 = auVar1._0_8_ / local_28;
    PointBase2D<double>::PointBase2D(&local_68,in_RDI[1].x * local_48,in_RDI[1].y * local_48);
    PVar7 = PointBase2D<double>::operator+(in_RDI,in_stack_ffffffffffffff88);
    local_58 = PVar7.x;
    *local_20 = local_58;
    local_50 = PVar7.y;
    local_20[1] = local_50;
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool intersection( const LineBase2D & line, PointBase2D<_Type> & point ) const
    {
        // based on Graphics Gems III, Faster Line Segment Intersection, p. 199-202
        // http://www.realtimerendering.com/resources/GraphicsGems/gems.html#gemsiii
        const _Type denominator = _direction.y * line._direction.x - _direction.x * line._direction.y;
        if ( pvmath::isEqual<_Type>( denominator, 0, 10 ) )
            return false; // they are parallel

        const PointBase2D<_Type> offset = _position - line._position;
        const _Type na = (line._direction.y * offset.x - line._direction.x * offset.y) / denominator;
        point = _position + PointBase2D<_Type>( _direction.x * na, _direction.y * na );
        return true;
    }